

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O0

lzma_ret lzma_block_header_size(lzma_block *block)

{
  lzma_ret lVar1;
  uint32_t local_30;
  lzma_ret ret_;
  uint32_t add_2;
  uint32_t add_1;
  uint32_t add;
  uint32_t size;
  size_t i;
  lzma_block *block_local;
  
  add_1 = 6;
  if (block->version == 0) {
    i = (size_t)block;
    if (block->compressed_size != 0xffffffffffffffff) {
      add_2 = lzma_vli_size(block->compressed_size);
      if ((add_2 == 0) || (*(long *)(i + 0x10) == 0)) {
        return LZMA_PROG_ERROR;
      }
      add_1 = add_2 + add_1;
    }
    if (*(long *)(i + 0x18) != -1) {
      ret_ = lzma_vli_size(*(lzma_vli *)(i + 0x18));
      if (ret_ == LZMA_OK) {
        return LZMA_PROG_ERROR;
      }
      add_1 = ret_ + add_1;
    }
    if ((*(long *)(i + 0x20) == 0) || (**(long **)(i + 0x20) == -1)) {
      block_local._4_4_ = LZMA_PROG_ERROR;
    }
    else {
      for (_add = 0; *(long *)(*(long *)(i + 0x20) + _add * 0x10) != -1; _add = _add + 1) {
        if (_add == 4) {
          return LZMA_PROG_ERROR;
        }
        lVar1 = lzma_filter_flags_size(&local_30,(lzma_filter *)(*(long *)(i + 0x20) + _add * 0x10))
        ;
        if (lVar1 != LZMA_OK) {
          return lVar1;
        }
        add_1 = local_30 + add_1;
      }
      *(uint32_t *)(i + 4) = add_1 + 3 & 0xfffffffc;
      block_local._4_4_ = LZMA_OK;
    }
  }
  else {
    block_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return block_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	size_t i;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	if (block->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		uint32_t add;

		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}